

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib530.c
# Opt level: O1

int test(char *URL)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  char *pcVar7;
  long lVar8;
  timeval tVar9;
  int maxfd;
  int running;
  CURL *curl [4];
  timeval interval;
  fd_set exc;
  fd_set wr;
  fd_set rd;
  char target_url [256];
  int local_2f8;
  int local_2f4;
  char *local_2f0;
  long local_2e8 [4];
  timeval local_2c8;
  fd_set local_2b8;
  fd_set local_238;
  fd_set local_1b8;
  undefined1 local_138 [255];
  undefined1 local_39;
  
  local_2e8[0] = 0;
  local_2e8[1] = 0;
  local_2e8[2] = 0;
  local_2e8[3] = 0;
  local_2f0 = URL;
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  pcVar7 = _stderr;
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    uVar3 = curl_easy_strerror(iVar1);
    curl_mfprintf(pcVar7,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                  ,0x2f,iVar1,uVar3);
  }
  if (iVar1 == 0) {
    lVar4 = curl_multi_init();
    if (lVar4 != 0) {
      lVar8 = 0;
LAB_00102363:
      if (lVar8 == 4) {
        iVar1 = curl_multi_add_handle(lVar4,local_2e8[0]);
        pcVar7 = _stderr;
        if (iVar1 == 0) {
          iVar1 = 0;
        }
        else {
          uVar3 = curl_multi_strerror(iVar1);
          curl_mfprintf(pcVar7,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                        ,0x44,iVar1,uVar3);
        }
        if (iVar1 == 0) {
          iVar2 = curl_multi_setopt(lVar4,3,1);
          pcVar7 = _stderr;
          iVar1 = 0;
          if (iVar2 != 0) {
            uVar3 = curl_multi_strerror(iVar2);
            curl_mfprintf(pcVar7,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                          ,0x46,iVar2,uVar3);
            iVar1 = iVar2;
          }
          if (iVar1 == 0) {
            curl_mfprintf(_stderr,"Start at URL 0\n");
            lVar8 = 1;
            iVar1 = 0;
            do {
              local_2f8 = -99;
              local_2c8.tv_sec = 1;
              local_2c8.tv_usec = 0;
              iVar2 = curl_multi_perform(lVar4,&local_2f4);
              pcVar7 = _stderr;
              if (iVar2 == 0) {
                if (local_2f4 < 0) {
                  curl_mfprintf(_stderr,
                                "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                                ,0x52);
                  iVar1 = 0x7a;
                }
              }
              else {
                uVar3 = curl_multi_strerror(iVar2);
                curl_mfprintf(pcVar7,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                              ,0x52,iVar2,uVar3);
                iVar1 = iVar2;
              }
              iVar2 = 0xf;
              if (iVar1 == 0) {
                tVar9 = tutil_tvnow();
                lVar5 = tutil_tvdiff(tVar9,tv_test_start);
                if (lVar5 < 0xea61) {
                  if (local_2f4 == 0) {
                    if ((int)lVar8 < 4) {
                      lVar8 = (long)(int)lVar8;
                      do {
                        if (lVar8 == 4) {
                          lVar8 = 4;
                          goto LAB_00102719;
                        }
                        iVar1 = curl_multi_add_handle(lVar4,local_2e8[lVar8]);
                        pcVar7 = _stderr;
                        if (iVar1 == 0) {
                          iVar1 = 0;
                        }
                        else {
                          uVar3 = curl_multi_strerror(iVar1);
                          curl_mfprintf(pcVar7,
                                        "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                                        ,0x5d,iVar1,uVar3);
                        }
                        lVar8 = lVar8 + 1;
                      } while (iVar1 == 0);
                    }
                    else {
                      iVar1 = 0;
                      iVar2 = 0x2b;
                    }
                  }
                  else {
LAB_00102719:
                    local_1b8.__fds_bits[0xe] = 0;
                    local_1b8.__fds_bits[0xf] = 0;
                    local_1b8.__fds_bits[0xc] = 0;
                    local_1b8.__fds_bits[0xd] = 0;
                    local_1b8.__fds_bits[10] = 0;
                    local_1b8.__fds_bits[0xb] = 0;
                    local_1b8.__fds_bits[8] = 0;
                    local_1b8.__fds_bits[9] = 0;
                    local_1b8.__fds_bits[6] = 0;
                    local_1b8.__fds_bits[7] = 0;
                    local_1b8.__fds_bits[4] = 0;
                    local_1b8.__fds_bits[5] = 0;
                    local_1b8.__fds_bits[2] = 0;
                    local_1b8.__fds_bits[3] = 0;
                    local_1b8.__fds_bits[0] = 0;
                    local_1b8.__fds_bits[1] = 0;
                    local_238.__fds_bits[0] = 0;
                    local_238.__fds_bits[1] = 0;
                    local_238.__fds_bits[2] = 0;
                    local_238.__fds_bits[3] = 0;
                    local_238.__fds_bits[4] = 0;
                    local_238.__fds_bits[5] = 0;
                    local_238.__fds_bits[6] = 0;
                    local_238.__fds_bits[7] = 0;
                    local_238.__fds_bits[8] = 0;
                    local_238.__fds_bits[9] = 0;
                    local_238.__fds_bits[10] = 0;
                    local_238.__fds_bits[0xb] = 0;
                    local_238.__fds_bits[0xc] = 0;
                    local_238.__fds_bits[0xd] = 0;
                    local_238.__fds_bits[0xe] = 0;
                    local_238.__fds_bits[0xf] = 0;
                    local_2b8.__fds_bits[0] = 0;
                    local_2b8.__fds_bits[1] = 0;
                    local_2b8.__fds_bits[2] = 0;
                    local_2b8.__fds_bits[3] = 0;
                    local_2b8.__fds_bits[4] = 0;
                    local_2b8.__fds_bits[5] = 0;
                    local_2b8.__fds_bits[6] = 0;
                    local_2b8.__fds_bits[7] = 0;
                    local_2b8.__fds_bits[8] = 0;
                    local_2b8.__fds_bits[9] = 0;
                    local_2b8.__fds_bits[10] = 0;
                    local_2b8.__fds_bits[0xb] = 0;
                    local_2b8.__fds_bits[0xc] = 0;
                    local_2b8.__fds_bits[0xd] = 0;
                    local_2b8.__fds_bits[0xe] = 0;
                    local_2b8.__fds_bits[0xf] = 0;
                    iVar1 = curl_multi_fdset(lVar4,&local_1b8,&local_238,&local_2b8,&local_2f8);
                    pcVar7 = _stderr;
                    if (iVar1 == 0) {
                      iVar1 = 0;
                      if (local_2f8 < -1) {
                        curl_mfprintf(_stderr,
                                      "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                                      ,100);
                        iVar1 = 0x7a;
                      }
                    }
                    else {
                      uVar3 = curl_multi_strerror(iVar1);
                      curl_mfprintf(pcVar7,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                                    ,100,iVar1,uVar3);
                    }
                    if (iVar1 == 0) {
                      iVar1 = select_wrapper(local_2f8 + 1,&local_1b8,&local_238,&local_2b8,
                                             &local_2c8);
                      if (iVar1 == -1) {
                        piVar6 = __errno_location();
                        iVar1 = *piVar6;
                        local_2f0 = _stderr;
                        pcVar7 = strerror(iVar1);
                        curl_mfprintf(local_2f0,"%s:%d select() failed, with errno %d (%s)\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                                      ,0x68,iVar1,pcVar7);
                        iVar1 = 0x79;
                      }
                      else {
                        tVar9 = tutil_tvnow();
                        lVar5 = tutil_tvdiff(tVar9,tv_test_start);
                        iVar1 = 0;
                        if (lVar5 < 0xea61) {
                          iVar2 = 0;
                        }
                        else {
                          curl_mfprintf(_stderr,
                                        "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                                        ,0x6a);
                          iVar1 = 0x7d;
                        }
                      }
                    }
                  }
                }
                else {
                  curl_mfprintf(_stderr,
                                "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                                ,0x54);
                  iVar1 = 0x7d;
                }
              }
            } while (iVar2 == 0);
            if ((iVar2 != 0x2b) && (iVar2 != 0xf)) goto LAB_001025ce;
          }
        }
      }
      else {
        lVar5 = curl_easy_init();
        local_2e8[lVar8] = lVar5;
        if (lVar5 == 0) {
          curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                        ,0x36);
          iVar1 = 0x7c;
        }
        else {
          curl_msnprintf(local_138,0x100,"%s%04i",local_2f0,(int)lVar8 + 1);
          local_39 = 0;
          iVar2 = curl_easy_setopt(lVar5,0x2712,local_138);
          pcVar7 = _stderr;
          iVar1 = 0;
          if (iVar2 != 0) {
            uVar3 = curl_easy_strerror(iVar2);
            curl_mfprintf(pcVar7,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                          ,0x3a,iVar2,uVar3);
            iVar1 = iVar2;
          }
          if (iVar1 == 0) {
            iVar2 = curl_easy_setopt(lVar5,0x29,1);
            pcVar7 = _stderr;
            iVar1 = 0;
            if (iVar2 != 0) {
              uVar3 = curl_easy_strerror(iVar2);
              curl_mfprintf(pcVar7,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                            ,0x3c,iVar2,uVar3);
              iVar1 = iVar2;
            }
            if (iVar1 == 0) goto code_r0x00102490;
          }
        }
      }
      goto LAB_0010259d;
    }
    curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                  ,0x31);
    iVar1 = 0x7b;
LAB_0010259d:
    lVar8 = 0;
    do {
      lVar5 = local_2e8[lVar8];
      curl_multi_remove_handle(lVar4,lVar5);
      curl_easy_cleanup(lVar5);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    curl_multi_cleanup(lVar4);
    curl_global_cleanup();
  }
LAB_001025ce:
  return iVar1;
code_r0x00102490:
  iVar2 = curl_easy_setopt(lVar5,0x2a,1);
  pcVar7 = _stderr;
  iVar1 = 0;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(pcVar7,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                  ,0x3e,iVar2,uVar3);
    iVar1 = iVar2;
  }
  lVar8 = lVar8 + 1;
  if (iVar1 != 0) goto LAB_0010259d;
  goto LAB_00102363;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl[NUM_HANDLES];
  int running;
  CURLM *m = NULL;
  int i;
  char target_url[256];
  int handles_added = 0;

  for(i = 0; i < NUM_HANDLES; i++)
    curl[i] = NULL;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(m);

  /* get NUM_HANDLES easy handles */
  for(i = 0; i < NUM_HANDLES; i++) {
    /* get an easy handle */
    easy_init(curl[i]);
    /* specify target */
    msnprintf(target_url, sizeof(target_url), "%s%04i", URL, i + 1);
    target_url[sizeof(target_url) - 1] = '\0';
    easy_setopt(curl[i], CURLOPT_URL, target_url);
    /* go verbose */
    easy_setopt(curl[i], CURLOPT_VERBOSE, 1L);
    /* include headers */
    easy_setopt(curl[i], CURLOPT_HEADER, 1L);
  }

  /* Add the first handle to multi. We do this to let libcurl detect
     that the server can do pipelining. The rest of the handles will be
     added later. */
  multi_add_handle(m, curl[handles_added++]);

  multi_setopt(m, CURLMOPT_PIPELINING, 1L);

  fprintf(stderr, "Start at URL 0\n");

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running) {
      if(handles_added >= NUM_HANDLES)
        break; /* done */

      /* Add the rest of the handles now that the first handle has completed
         its request. */
      while(handles_added < NUM_HANDLES)
        multi_add_handle(m, curl[handles_added++]);
    }

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PB */

  for(i = 0; i < NUM_HANDLES; i++) {
    curl_multi_remove_handle(m, curl[i]);
    curl_easy_cleanup(curl[i]);
  }

  curl_multi_cleanup(m);
  curl_global_cleanup();

  return res;
}